

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O2

void deqp::gls::ShaderExecUtil::checkTessSupport
               (RenderContext *renderCtx,ShaderSpec *shaderSpec,ShaderType stage)

{
  bool bVar1;
  int extraout_EDX;
  int extraout_EDX_00;
  int required;
  deUint32 pname;
  allocator<char> local_39;
  string local_38;
  
  bVar1 = glu::glslVersionIsES(shaderSpec->version);
  required = extraout_EDX;
  if ((bVar1) && ((int)shaderSpec->version < 3)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"GL_EXT_tessellation_shader",&local_39);
    checkExtension(renderCtx,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    required = extraout_EDX_00;
  }
  if (stage == SHADERTYPE_TESSELLATION_CONTROL) {
    pname = 0x90d8;
  }
  else {
    if (stage != SHADERTYPE_TESSELLATION_EVALUATION) {
      return;
    }
    pname = 0x90d9;
  }
  checkLimit(renderCtx,pname,required);
  return;
}

Assistant:

void checkTessSupport (const glu::RenderContext& renderCtx, const ShaderSpec& shaderSpec, glu::ShaderType stage)
{
	const int numBlockRequired = 2; // highest binding is always 1 (output) i.e. count == 2

	if (glu::glslVersionIsES(shaderSpec.version) && shaderSpec.version <= glu::GLSL_VERSION_310_ES)
		checkExtension(renderCtx, "GL_EXT_tessellation_shader");

	if (stage == glu::SHADERTYPE_TESSELLATION_CONTROL)
		checkLimit(renderCtx, GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS, numBlockRequired);
	else if (stage == glu::SHADERTYPE_TESSELLATION_EVALUATION)
		checkLimit(renderCtx, GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS, numBlockRequired);
	else
		DE_ASSERT(false);
}